

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

int unix_write(int fd,uchar *buf,size_t size)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    while( true ) {
      sVar3 = write(fd,buf + uVar5,size - uVar5);
      iVar1 = (int)sVar3;
      if (iVar1 == 0) {
        return 0;
      }
      if (-1 < iVar1) break;
      piVar4 = __errno_location();
      if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
        perror("write");
        return -1;
      }
    }
    uVar2 = iVar1 + (int)uVar5;
    uVar5 = (ulong)uVar2;
    if (uVar2 == size) {
      return uVar2;
    }
  } while( true );
}

Assistant:

int unix_write(int fd, unsigned char *buf, size_t size) {
  int i, len = 0;

  while ((i = write(fd, buf + len, size - len))) {
    if (i < 0) {
      if ((errno == EINTR) || (errno == EAGAIN))
        continue;
      else {
        perror("write");
        return -1;
      }
    } else {
      len += i;
      if (len == size)
        break;
    }
  }

  if (i == 0)
    return 0;
  else
    return len;
}